

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O0

int dwarf_get_aranges(Dwarf_Debug dbg,Dwarf_Arange **aranges,Dwarf_Signed *returned_count,
                     Dwarf_Error *error)

{
  Dwarf_Chain_conflict space;
  int iVar1;
  Dwarf_Chain_conflict prev;
  long lStack_58;
  int res;
  Dwarf_Signed i;
  Dwarf_Chain_conflict head_chain;
  Dwarf_Chain_conflict curr_chain;
  Dwarf_Arange *arange_block;
  Dwarf_Signed arange_count;
  Dwarf_Error *error_local;
  Dwarf_Signed *returned_count_local;
  Dwarf_Arange **aranges_local;
  Dwarf_Debug dbg_local;
  
  arange_block = (Dwarf_Arange *)0x0;
  curr_chain = (Dwarf_Chain_conflict)0x0;
  head_chain = (Dwarf_Chain_conflict)0x0;
  i = 0;
  arange_count = (Dwarf_Signed)error;
  error_local = (Dwarf_Error *)returned_count;
  returned_count_local = (Dwarf_Signed *)aranges;
  aranges_local = (Dwarf_Arange **)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_aranges()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    dbg_local._4_4_ = _dwarf_load_section(dbg,&dbg->de_debug_aranges,error);
    if ((dbg_local._4_4_ == 0) &&
       (dbg_local._4_4_ =
             _dwarf_load_debug_info((Dwarf_Debug)aranges_local,(Dwarf_Error *)arange_count),
       dbg_local._4_4_ == 0)) {
      iVar1 = _dwarf_get_aranges_list
                        ((Dwarf_Debug)aranges_local,(Dwarf_Chain_conflict *)&i,
                         (Dwarf_Signed *)&arange_block,(Dwarf_Error *)arange_count);
      if (iVar1 == 0) {
        curr_chain = (Dwarf_Chain_conflict)
                     _dwarf_get_alloc((Dwarf_Debug)aranges_local,'\x0f',(Dwarf_Unsigned)arange_block
                                     );
        if (curr_chain == (Dwarf_Chain_conflict)0x0) {
          _dwarf_error((Dwarf_Debug)aranges_local,(Dwarf_Error *)arange_count,0x3e);
          free_aranges_chain((Dwarf_Debug)aranges_local,(Dwarf_Chain_conflict)i);
          dbg_local._4_4_ = 1;
        }
        else {
          head_chain = (Dwarf_Chain_conflict)i;
          for (lStack_58 = 0; space = head_chain, lStack_58 < (long)arange_block;
              lStack_58 = lStack_58 + 1) {
            (&curr_chain->ch_item)[lStack_58] = head_chain->ch_item;
            head_chain->ch_item = (void *)0x0;
            head_chain = head_chain->ch_next;
            dwarf_dealloc((Dwarf_Debug)aranges_local,space,0x1f);
          }
          *returned_count_local = (Dwarf_Signed)curr_chain;
          *error_local = (Dwarf_Error)arange_block;
          dbg_local._4_4_ = 0;
        }
      }
      else {
        free_aranges_chain((Dwarf_Debug)aranges_local,(Dwarf_Chain_conflict)i);
        dbg_local._4_4_ = iVar1;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_aranges(Dwarf_Debug dbg,
    Dwarf_Arange ** aranges,
    Dwarf_Signed * returned_count, Dwarf_Error * error)
{
    /* Count of total number of aranges. */
    Dwarf_Signed arange_count = 0;

    Dwarf_Arange *arange_block = 0;

    /* Used to chain Dwarf_Aranges structs. */
    Dwarf_Chain curr_chain = NULL;
    Dwarf_Chain head_chain = NULL;
    Dwarf_Signed i = 0;
    int res = DW_DLV_ERROR;

    /* ***** BEGIN CODE ***** */

    CHECK_DBG(dbg,error,"dwarf_get_aranges()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_aranges, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    /*  aranges points in to info, so if info needs expanding
        we have to load it. */
    res = _dwarf_load_debug_info(dbg, error);
    if (res != DW_DLV_OK) {
        return res;
    }

    res = _dwarf_get_aranges_list(dbg,&head_chain,
        &arange_count,error);
    if (res != DW_DLV_OK) {
        free_aranges_chain(dbg,head_chain);
        return res;
    }

    arange_block = (Dwarf_Arange *)
        _dwarf_get_alloc(dbg, DW_DLA_LIST, arange_count);
    if (arange_block == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        free_aranges_chain(dbg,head_chain);
        return DW_DLV_ERROR;
    }

    /* See also free_aranges_chain() above */
    curr_chain = head_chain;
    for (i = 0; i < arange_count; i++) {
        Dwarf_Chain prev = 0;

        /*  Copies pointers. No dealloc of ch_item, */
        *(arange_block + i) = curr_chain->ch_item;
        curr_chain->ch_item = 0;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN);
    }
    *aranges = arange_block;
    *returned_count = (arange_count);
    return DW_DLV_OK;
}